

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values_unittest.cc
# Opt level: O2

void __thiscall
bssl::der::test::ParseValuesTest_ParseUint64_Test::ParseValuesTest_ParseUint64_Test
          (ParseValuesTest_ParseUint64_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0059b710;
  return;
}

Assistant:

TEST(ParseValuesTest, ParseUint64) {
  for (size_t i = 0; i < std::size(kUint64TestData); i++) {
    const Uint64TestData &test_case = kUint64TestData[i];
    SCOPED_TRACE(i);

    uint64_t result;
    EXPECT_EQ(test_case.should_pass,
              ParseUint64(Input(test_case.input, test_case.length), &result));
    if (test_case.should_pass) {
      EXPECT_EQ(test_case.expected_value, result);
    }
  }
}